

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraCodeBlocksGenerator::CreateNewProjectFile
          (cmExtraCodeBlocksGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *filename)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  uint uVar1;
  cmMakefile *this_00;
  cmMakefile *pcVar2;
  cmSourceFile *this_01;
  cmTarget *this_02;
  bool bVar3;
  __type _Var4;
  int iVar5;
  cmGlobalGenerator *pcVar6;
  char *pcVar7;
  long lVar8;
  cmSystemTools *this_03;
  _Base_ptr p_Var9;
  ostream *poVar10;
  char *__s2;
  string *psVar11;
  vector<cmTarget_const*,std::allocator<cmTarget_const*>> *this_04;
  iterator iVar12;
  mapped_type *__x;
  mapped_type *this_05;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_RCX;
  pointer ppcVar13;
  _Alloc_hider _Var14;
  pointer pbVar15;
  __node_base *p_Var16;
  pointer ppcVar17;
  _Base_ptr p_Var18;
  pointer pbVar19;
  bool bVar20;
  allocator local_431;
  cmTarget *local_430;
  string compiler;
  all_files_map_t allFiles;
  string unitFiles;
  cmTarget *local_3a0;
  string virtualFolders;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string lang;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cFiles;
  string fullPath;
  string make;
  Tree tree;
  cmGeneratedFileStream fout;
  
  this_00 = (*(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
              _M_impl.super__Vector_impl_data._M_start)->Makefile;
  cmGeneratedFileStream::cmGeneratedFileStream(&fout,(filename->_M_dataplus)._M_p,false);
  if (((&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    tree.path._M_dataplus._M_p = (pointer)&tree.path.field_2;
    tree.path._M_string_length = 0;
    tree.path.field_2._M_local_buf[0] = '\0';
    tree.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    tree.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    tree.folders.super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    tree.files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tree.files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tree.files.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar6 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    p_Var9 = (pcVar6->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_430 = (cmTarget *)this;
    while (this_02 = local_430,
          (_Rb_tree_header *)p_Var9 != &(pcVar6->ProjectMap)._M_t._M_impl.super__Rb_tree_header) {
      unitFiles._M_dataplus._M_p = (pointer)0x0;
      unitFiles._M_string_length = 0;
      unitFiles.field_2._M_allocated_capacity = 0;
      for (p_Var18 = *(_Base_ptr *)(p_Var9 + 2); p_Var18 != p_Var9[2]._M_parent;
          p_Var18 = (_Base_ptr)&p_Var18->_M_parent) {
        in_RCX._M_current =
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (*(long *)(*(long *)p_Var18 + 0x28) + 400);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&unitFiles,
                   (const_iterator)unitFiles._M_string_length,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (*(long *)(*(long *)p_Var18 + 0x28) + 0x188),in_RCX);
      }
      std::__cxx11::string::string((string *)&allFiles,"CMAKE_ROOT",(allocator *)&virtualFolders);
      pcVar7 = cmMakefile::GetDefinition(this_00,(string *)&allFiles);
      std::__cxx11::string::~string((string *)&allFiles);
      for (_Var14 = unitFiles._M_dataplus; _Var14._M_p != (pointer)unitFiles._M_string_length;
          _Var14._M_p = _Var14._M_p + 0x20) {
        lVar8 = std::__cxx11::string::find(_Var14._M_p,(ulong)pcVar7);
        if (lVar8 != 0) {
          this_03 = (cmSystemTools *)
                    cmMakefile::GetHomeDirectory(*(cmMakefile **)(**(long **)(p_Var9 + 2) + 0x28));
          cmSystemTools::RelativePath_abi_cxx11_
                    ((string *)&allFiles,this_03,*(char **)_Var14._M_p,(char *)in_RCX._M_current);
          compiler._M_dataplus._M_p = (pointer)0x0;
          compiler._M_string_length = 0;
          compiler.field_2._M_allocated_capacity = 0;
          cmsys::SystemTools::SplitPath
                    ((string *)&allFiles,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&compiler,false);
          std::__cxx11::string::string
                    ((string *)&virtualFolders,(string *)(compiler._M_string_length - 0x20));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&compiler,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  (compiler._M_string_length - 0x20),(const_iterator)compiler._M_string_length);
          if (((pointer)compiler._M_string_length != compiler._M_dataplus._M_p) &&
             (lVar8 = std::__cxx11::string::find((char *)&allFiles,0x49d9c1), lVar8 == -1)) {
            in_RCX._M_current = &virtualFolders;
            Tree::InsertPath(&tree,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&compiler,1,in_RCX._M_current);
          }
          std::__cxx11::string::~string((string *)&virtualFolders);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&compiler);
          std::__cxx11::string::~string((string *)&allFiles);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&unitFiles);
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      pcVar6 = (cmGlobalGenerator *)
               (local_430->Properties).
               super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    }
    virtualFolders._M_dataplus._M_p = (pointer)&virtualFolders.field_2;
    virtualFolders._M_string_length = 0;
    virtualFolders.field_2._M_local_buf[0] = '\0';
    Tree::BuildVirtualFolder(&tree,&virtualFolders);
    unitFiles._M_dataplus._M_p = (pointer)&unitFiles.field_2;
    unitFiles._M_string_length = 0;
    unitFiles.field_2._M_allocated_capacity =
         unitFiles.field_2._M_allocated_capacity & 0xffffffffffffff00;
    pcVar7 = cmMakefile::GetHomeDirectory(this_00);
    std::__cxx11::string::string((string *)&compiler,pcVar7,(allocator *)&make);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&allFiles,
                   &compiler,"/");
    Tree::BuildUnit(&tree,&unitFiles,(string *)&allFiles);
    std::__cxx11::string::~string((string *)&allFiles);
    std::__cxx11::string::~string((string *)&compiler);
    GetCBCompilerId_abi_cxx11_(&compiler,(cmExtraCodeBlocksGenerator *)this_02,this_00);
    std::__cxx11::string::string((string *)&allFiles,"CMAKE_MAKE_PROGRAM",(allocator *)&lang);
    pcVar7 = cmMakefile::GetRequiredDefinition(this_00,(string *)&allFiles);
    std::__cxx11::string::string((string *)&make,pcVar7,(allocator *)&fullPath);
    std::__cxx11::string::~string((string *)&allFiles);
    poVar10 = std::operator<<((ostream *)&fout,
                              "<?xml version=\"1.0\" encoding=\"UTF-8\" standalone=\"yes\" ?>\n<CodeBlocks_project_file>\n   <FileVersion major=\"1\" minor=\"6\" />\n   <Project>\n      <Option title=\""
                             );
    poVar10 = std::operator<<(poVar10,(this_00->ProjectName)._M_dataplus._M_p);
    poVar10 = std::operator<<(poVar10,
                              "\" />\n      <Option makefile_is_custom=\"1\" />\n      <Option compiler=\""
                             );
    poVar10 = std::operator<<(poVar10,(string *)&compiler);
    poVar10 = std::operator<<(poVar10,"\" />\n      ");
    poVar10 = std::operator<<(poVar10,(string *)&virtualFolders);
    std::operator<<(poVar10,"\n      <Build>\n");
    std::__cxx11::string::string((string *)&allFiles,"all",(allocator *)&lang);
    AppendTarget((cmExtraCodeBlocksGenerator *)this_02,&fout,(string *)&allFiles,(cmTarget *)0x0,
                 make._M_dataplus._M_p,
                 *(lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start,compiler._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&allFiles);
    for (ppcVar13 = (lgs->
                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        ppcVar13 !=
        (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppcVar13 = ppcVar13 + 1) {
      pcVar2 = (*ppcVar13)->Makefile;
      p_Var16 = &(pcVar2->Targets)._M_h._M_before_begin;
LAB_003956be:
      while (p_Var16 = p_Var16->_M_nxt, p_Var16 != (__node_base *)0x0) {
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var16 + 1);
        uVar1 = *(uint *)&p_Var16[0x61]._M_nxt;
        if (uVar1 < 5) {
          AppendTarget((cmExtraCodeBlocksGenerator *)local_430,&fout,__lhs,(cmTarget *)(p_Var16 + 5)
                       ,make._M_dataplus._M_p,*ppcVar13,compiler._M_dataplus._M_p);
          std::__cxx11::string::string((string *)&allFiles,(string *)__lhs);
          std::__cxx11::string::append((char *)&allFiles);
          AppendTarget((cmExtraCodeBlocksGenerator *)local_430,&fout,(string *)&allFiles,
                       (cmTarget *)(p_Var16 + 5),make._M_dataplus._M_p,*ppcVar13,
                       compiler._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&allFiles);
        }
        else {
          if (uVar1 == 5) goto LAB_003957a1;
          if (uVar1 == 6) {
            pcVar7 = cmMakefile::GetCurrentBinaryDirectory(pcVar2);
            __s2 = cmMakefile::GetHomeOutputDirectory(pcVar2);
            iVar5 = strcmp(pcVar7,__s2);
            if (iVar5 == 0) goto LAB_00395828;
          }
        }
      }
    }
    std::operator<<((ostream *)&fout,"      </Build>\n");
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &allFiles._M_t._M_impl.super__Rb_tree_header._M_header;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    cFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cFiles.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (ppcVar13 = (lgs->
                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        ppcVar13 !=
        (lgs->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppcVar13 = ppcVar13 + 1) {
      pcVar2 = (*ppcVar13)->Makefile;
      p_Var16 = &(pcVar2->Targets)._M_h._M_before_begin;
      while( true ) {
        p_Var16 = p_Var16->_M_nxt;
        if (p_Var16 == (__node_base *)0x0) break;
        if (*(uint *)&p_Var16[0x61]._M_nxt < 6) {
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::string::string
                    ((string *)&fullPath,"CMAKE_BUILD_TYPE",(allocator *)&local_3a0);
          pcVar7 = cmMakefile::GetSafeDefinition(pcVar2,&fullPath);
          std::__cxx11::string::string((string *)&lang,pcVar7,&local_431);
          local_430 = (cmTarget *)(p_Var16 + 5);
          cmTarget::GetSourceFiles(local_430,&sources,&lang);
          std::__cxx11::string::~string((string *)&lang);
          std::__cxx11::string::~string((string *)&fullPath);
          for (ppcVar17 = sources.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
              ppcVar17 !=
              sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish; ppcVar17 = ppcVar17 + 1) {
            this_01 = *ppcVar17;
            std::__cxx11::string::string((string *)&lang,"GENERATED",(allocator *)&fullPath);
            bVar3 = cmSourceFile::GetPropertyAsBool(this_01,&lang);
            std::__cxx11::string::~string((string *)&lang);
            if (!bVar3) {
              cmSourceFile::GetLanguage_abi_cxx11_(&lang,*ppcVar17);
              bVar3 = std::operator==(&lang,"C");
              if ((bVar3) || (bVar3 = std::operator==(&lang,"CXX"), bVar3)) {
                psVar11 = cmSourceFile::GetExtension_abi_cxx11_(*ppcVar17);
                std::__cxx11::string::string((string *)&fullPath,(string *)psVar11);
                pbVar15 = (this_00->SourceFileExtensions).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  bVar20 = pbVar15 ==
                           (this_00->SourceFileExtensions).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  bVar3 = !bVar20;
                  if (bVar20) break;
                  _Var4 = std::operator==(&fullPath,pbVar15);
                  pbVar15 = pbVar15 + 1;
                } while (!_Var4);
                std::__cxx11::string::~string((string *)&fullPath);
              }
              else {
                bVar3 = false;
              }
              psVar11 = cmSourceFile::GetFullPath(*ppcVar17,(string *)0x0);
              std::__cxx11::string::string((string *)&fullPath,(string *)psVar11);
              if (bVar3) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&cFiles,&fullPath);
              }
              this_04 = (vector<cmTarget_const*,std::allocator<cmTarget_const*>> *)
                        std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                        ::operator[](&allFiles,&fullPath);
              local_3a0 = local_430;
              std::vector<cmTarget_const*,std::allocator<cmTarget_const*>>::
              emplace_back<cmTarget_const*>(this_04,&local_3a0);
              std::__cxx11::string::~string((string *)&fullPath);
              std::__cxx11::string::~string((string *)&lang);
            }
          }
          std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
                    (&sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
        }
      }
    }
    for (pbVar15 = cFiles.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar15 !=
        cFiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar15 = pbVar15 + 1) {
      cmsys::SystemTools::GetFilenamePath(&lang,pbVar15);
      std::__cxx11::string::append((char *)&lang);
      cmsys::SystemTools::GetFilenameWithoutExtension(&fullPath,pbVar15);
      std::__cxx11::string::append((string *)&lang);
      std::__cxx11::string::~string((string *)&fullPath);
      for (pbVar19 = (this_00->HeaderFileExtensions).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar19 !=
          (this_00->HeaderFileExtensions).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar19 = pbVar19 + 1) {
        std::__cxx11::string::string((string *)&fullPath,(string *)&lang);
        std::__cxx11::string::append((char *)&fullPath);
        std::__cxx11::string::append((string *)&fullPath);
        iVar12 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                 ::find(&allFiles._M_t,&fullPath);
        if ((_Rb_tree_header *)iVar12._M_node != &allFiles._M_t._M_impl.super__Rb_tree_header) {
LAB_00395bcb:
          std::__cxx11::string::~string((string *)&fullPath);
          break;
        }
        bVar3 = cmsys::SystemTools::FileExists(fullPath._M_dataplus._M_p);
        if (bVar3) {
          __x = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                              *)&allFiles._M_t,pbVar15);
          this_05 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
                                  *)&allFiles._M_t,&fullPath);
          std::vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>::operator=
                    (&this_05->Targets,&__x->Targets);
          goto LAB_00395bcb;
        }
        std::__cxx11::string::~string((string *)&fullPath);
      }
      std::__cxx11::string::~string((string *)&lang);
    }
    for (p_Var9 = allFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != &allFiles._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      poVar10 = std::operator<<((ostream *)&fout,"      <Unit filename=\"");
      cmXMLSafe::cmXMLSafe((cmXMLSafe *)&lang,(string *)(p_Var9 + 1));
      poVar10 = operator<<(poVar10,(cmXMLSafe *)&lang);
      std::operator<<(poVar10,"\">\n");
      for (p_Var18 = *(_Base_ptr *)(p_Var9 + 2); p_Var18 != p_Var9[2]._M_parent;
          p_Var18 = (_Base_ptr)&p_Var18->_M_parent) {
        lVar8 = *(long *)p_Var18;
        poVar10 = std::operator<<((ostream *)&fout,"         <Option target=\"");
        cmXMLSafe::cmXMLSafe((cmXMLSafe *)&lang,(string *)(lVar8 + 0x1a8));
        poVar10 = operator<<(poVar10,(cmXMLSafe *)&lang);
        std::operator<<(poVar10,"\"/>\n");
      }
      std::operator<<((ostream *)&fout,"      </Unit>\n");
    }
    std::operator<<((ostream *)&fout,(string *)&unitFiles);
    std::operator<<((ostream *)&fout,"   </Project>\n</CodeBlocks_project_file>\n");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&cFiles);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExtraCodeBlocksGenerator::CbpUnit>_>_>
    ::~_Rb_tree(&allFiles._M_t);
    std::__cxx11::string::~string((string *)&make);
    std::__cxx11::string::~string((string *)&compiler);
    std::__cxx11::string::~string((string *)&unitFiles);
    std::__cxx11::string::~string((string *)&virtualFolders);
    Tree::~Tree(&tree);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  return;
LAB_003957a1:
  lVar8 = std::__cxx11::string::find((char *)__lhs,0x4bbadc);
  if ((((lVar8 != 0) || (bVar3 = std::operator!=(__lhs,"Nightly"), !bVar3)) &&
      ((lVar8 = std::__cxx11::string::find((char *)__lhs,0x4bbae4), lVar8 != 0 ||
       (bVar3 = std::operator!=(__lhs,"Continuous"), !bVar3)))) &&
     ((lVar8 = std::__cxx11::string::find((char *)__lhs,0x4bbaef), lVar8 != 0 ||
      (bVar3 = std::operator!=(__lhs,"Experimental"), !bVar3)))) {
LAB_00395828:
    AppendTarget((cmExtraCodeBlocksGenerator *)local_430,&fout,__lhs,(cmTarget *)0x0,
                 make._M_dataplus._M_p,*ppcVar13,compiler._M_dataplus._M_p);
  }
  goto LAB_003956be;
}

Assistant:

void cmExtraCodeBlocksGenerator
  ::CreateNewProjectFile(const std::vector<cmLocalGenerator*>& lgs,
                         const std::string& filename)
{
  const cmMakefile* mf=lgs[0]->GetMakefile();
  cmGeneratedFileStream fout(filename.c_str());
  if(!fout)
    {
    return;
    }

  Tree tree;

  // build tree of virtual folders
  for (std::map<std::string, std::vector<cmLocalGenerator*> >::const_iterator
          it = this->GlobalGenerator->GetProjectMap().begin();
         it != this->GlobalGenerator->GetProjectMap().end();
         ++it)
    {
    // Collect all files
    std::vector<std::string> listFiles;
    for (std::vector<cmLocalGenerator *>::const_iterator
         jt = it->second.begin();
         jt != it->second.end();
         ++jt)
      {
      const std::vector<std::string> & files =
                                          (*jt)->GetMakefile()->GetListFiles();
      listFiles.insert(listFiles.end(), files.begin(), files.end());
      }

    // Convert
    const char* cmakeRoot = mf->GetDefinition("CMAKE_ROOT");
    for (std::vector<std::string>::const_iterator jt = listFiles.begin();
         jt != listFiles.end();
         ++jt)
      {
      // don't put cmake's own files into the project (#12110):
      if (jt->find(cmakeRoot) == 0)
        {
        continue;
        }

      const std::string &relative = cmSystemTools::RelativePath(
                         it->second[0]->GetMakefile()->GetHomeDirectory(),
                         jt->c_str());
      std::vector<std::string> splitted;
      cmSystemTools::SplitPath(relative, splitted, false);
      // Split filename from path
      std::string fileName = *(splitted.end()-1);
      splitted.erase(splitted.end() - 1, splitted.end());

      // We don't want paths with CMakeFiles in them
      // or do we?
      // In speedcrunch those where purely internal
      if (splitted.size() >= 1
          && relative.find("CMakeFiles") == std::string::npos)
        {
        tree.InsertPath(splitted, 1, fileName);
        }
      }
    }

  // Now build a virtual tree string
  std::string virtualFolders;
  tree.BuildVirtualFolder(virtualFolders);
  // And one for <Unit>
  std::string unitFiles;
  tree.BuildUnit(unitFiles, std::string(mf->GetHomeDirectory()) + "/");

  // figure out the compiler
  std::string compiler = this->GetCBCompilerId(mf);
  std::string make = mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM");

  fout<<"<?xml version=\"1.0\" encoding=\"UTF-8\" standalone=\"yes\" ?>\n"
        "<CodeBlocks_project_file>\n"
        "   <FileVersion major=\"1\" minor=\"6\" />\n"
        "   <Project>\n"
        "      <Option title=\"" << mf->GetProjectName()<<"\" />\n"
        "      <Option makefile_is_custom=\"1\" />\n"
        "      <Option compiler=\"" << compiler << "\" />\n"
        "      "<<virtualFolders<<"\n"
        "      <Build>\n";

  this->AppendTarget(fout, "all", 0, make.c_str(), lgs[0], compiler.c_str());

  // add all executable and library targets and some of the GLOBAL
  // and UTILITY targets
  for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
       lg!=lgs.end(); lg++)
    {
    cmMakefile* makefile=(*lg)->GetMakefile();
    cmTargets& targets=makefile->GetTargets();
    for (cmTargets::iterator ti = targets.begin();
         ti != targets.end(); ti++)
      {
      switch(ti->second.GetType())
        {
        case cmTarget::GLOBAL_TARGET:
          {
          // Only add the global targets from CMAKE_BINARY_DIR,
          // not from the subdirs
          if (strcmp(makefile->GetCurrentBinaryDirectory(),
                     makefile->GetHomeOutputDirectory())==0)
            {
            this->AppendTarget(fout, ti->first, 0,
                               make.c_str(), *lg, compiler.c_str());
            }
          }
          break;
        case cmTarget::UTILITY:
          // Add all utility targets, except the Nightly/Continuous/
          // Experimental-"sub"targets as e.g. NightlyStart
          if (((ti->first.find("Nightly")==0)   &&(ti->first!="Nightly"))
             || ((ti->first.find("Continuous")==0)&&(ti->first!="Continuous"))
             || ((ti->first.find("Experimental")==0)
                                               && (ti->first!="Experimental")))
            {
            break;
            }

          this->AppendTarget(fout, ti->first, 0,
                                 make.c_str(), *lg, compiler.c_str());
          break;
        case cmTarget::EXECUTABLE:
        case cmTarget::STATIC_LIBRARY:
        case cmTarget::SHARED_LIBRARY:
        case cmTarget::MODULE_LIBRARY:
        case cmTarget::OBJECT_LIBRARY:
          {
          this->AppendTarget(fout, ti->first, &ti->second,
                             make.c_str(), *lg, compiler.c_str());
          std::string fastTarget = ti->first;
          fastTarget += "/fast";
          this->AppendTarget(fout, fastTarget, &ti->second,
                             make.c_str(), *lg, compiler.c_str());
          }
          break;
        default:
          break;
        }
      }
    }

  fout<<"      </Build>\n";


  // Collect all used source files in the project.
  // Keep a list of C/C++ source files which might have an acompanying header
  // that should be looked for.
  typedef std::map<std::string, CbpUnit> all_files_map_t;
  all_files_map_t allFiles;
  std::vector<std::string> cFiles;

  for (std::vector<cmLocalGenerator*>::const_iterator lg=lgs.begin();
       lg!=lgs.end(); lg++)
    {
    cmMakefile* makefile=(*lg)->GetMakefile();
    cmTargets& targets=makefile->GetTargets();
    for (cmTargets::iterator ti = targets.begin();
         ti != targets.end(); ti++)
      {
      switch(ti->second.GetType())
        {
        case cmTarget::EXECUTABLE:
        case cmTarget::STATIC_LIBRARY:
        case cmTarget::SHARED_LIBRARY:
        case cmTarget::MODULE_LIBRARY:
        case cmTarget::OBJECT_LIBRARY:
        case cmTarget::UTILITY: // can have sources since 2.6.3
          {
          std::vector<cmSourceFile*> sources;
          ti->second.GetSourceFiles(sources,
                            makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (std::vector<cmSourceFile*>::const_iterator si=sources.begin();
               si!=sources.end(); si++)
            {
            // don't add source files which have the GENERATED property set:
            if ((*si)->GetPropertyAsBool("GENERATED"))
              {
              continue;
              }

            // check whether it is a C/C++ implementation file
            bool isCFile = false;
            std::string lang = (*si)->GetLanguage();
            if (lang == "C" || lang == "CXX")
              {
              std::string srcext = (*si)->GetExtension();
              for(std::vector<std::string>::const_iterator
                  ext = mf->GetSourceExtensions().begin();
                  ext !=  mf->GetSourceExtensions().end();
                  ++ext)
                {
                if (srcext == *ext)
                  {
                  isCFile = true;
                  break;
                  }
                }
              }

            std::string fullPath = (*si)->GetFullPath();

            if(isCFile)
              {
              cFiles.push_back(fullPath);
              }

            CbpUnit &cbpUnit = allFiles[fullPath];
            cbpUnit.Targets.push_back(&(ti->second));
            }
          }
        default:  // intended fallthrough
          break;
        }
      }
    }

  // The following loop tries to add header files matching to implementation
  // files to the project. It does that by iterating over all
  // C/C++ source files,
  // replacing the file name extension with ".h" and checks whether such a
  // file exists. If it does, it is inserted into the map of files.
  // A very similar version of that code exists also in the kdevelop
  // project generator.
  for (std::vector<std::string>::const_iterator
       sit=cFiles.begin();
       sit!=cFiles.end();
       ++sit)
    {
    std::string const& fileName = *sit;
    std::string headerBasename=cmSystemTools::GetFilenamePath(fileName);
    headerBasename+="/";
    headerBasename+=cmSystemTools::GetFilenameWithoutExtension(fileName);

    // check if there's a matching header around
    for(std::vector<std::string>::const_iterator
        ext = mf->GetHeaderExtensions().begin();
        ext !=  mf->GetHeaderExtensions().end();
        ++ext)
      {
      std::string hname=headerBasename;
      hname += ".";
      hname += *ext;
      // if it's already in the set, don't check if it exists on disk
      if (allFiles.find(hname) != allFiles.end())
        {
        break;
        }

      if(cmSystemTools::FileExists(hname.c_str()))
        {
        allFiles[hname].Targets = allFiles[fileName].Targets;
        break;
        }
      }
    }

  // insert all source files in the CodeBlocks project
  for (all_files_map_t::const_iterator
       sit=allFiles.begin();
       sit!=allFiles.end();
       ++sit)
    {
    std::string const& unitFilename = sit->first;
    CbpUnit const& unit = sit->second;

    fout<<"      <Unit filename=\""<< cmXMLSafe(unitFilename) <<"\">\n";

    for(std::vector<const cmTarget*>::const_iterator ti = unit.Targets.begin();
      ti != unit.Targets.end(); ++ti)
      {
      std::string const& targetName = (*ti)->GetName();
      fout<<"         <Option target=\""<< cmXMLSafe(targetName) <<"\"/>\n";
      }

    fout<<"      </Unit>\n";
    }

  // Add CMakeLists.txt
  fout<<unitFiles;

  fout<<"   </Project>\n"
        "</CodeBlocks_project_file>\n";
}